

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall QGraphicsBlurEffect::setBlurRadius(QGraphicsBlurEffect *this,qreal radius)

{
  long lVar1;
  bool bVar2;
  qreal p1;
  
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  p1 = QPixmapBlurFilter::radius(*(QPixmapBlurFilter **)(lVar1 + 0xa8));
  bVar2 = qFuzzyCompare(p1,radius);
  if (bVar2) {
    return;
  }
  QPixmapBlurFilter::setRadius(*(QPixmapBlurFilter **)(lVar1 + 0xa8),radius);
  QGraphicsEffect::updateBoundingRect(&this->super_QGraphicsEffect);
  blurRadiusChanged(this,radius);
  return;
}

Assistant:

void QGraphicsBlurEffect::setBlurRadius(qreal radius)
{
    Q_D(QGraphicsBlurEffect);
    if (qFuzzyCompare(d->filter->radius(), radius))
        return;

    d->filter->setRadius(radius);
    updateBoundingRect();
    emit blurRadiusChanged(radius);
}